

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O0

void __thiscall baryonyx::problem::problem(problem *this,raw_problem *pb)

{
  problem_solver_type pVar1;
  raw_problem *pb_local;
  problem *this_local;
  
  std::shared_ptr<baryonyx::string_buffer>::shared_ptr(&this->strings,&pb->strings);
  objective_function::objective_function(&this->objective,&pb->objective);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->equal_constraints,&pb->equal_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->greater_constraints,&pb->greater_constraints);
  std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::vector
            (&this->less_constraints,&pb->less_constraints);
  baryonyx::variables::variables(&this->vars,&pb->vars);
  affected_variables::affected_variables(&this->affected_vars);
  this->type = pb->type;
  this->problem_type = equalities_01;
  pVar1 = which_problem_type(this);
  this->problem_type = pVar1;
  return;
}

Assistant:

problem(const raw_problem& pb)
      : strings(pb.strings)
      , objective(pb.objective)
      , equal_constraints(pb.equal_constraints)
      , greater_constraints(pb.greater_constraints)
      , less_constraints(pb.less_constraints)
      , vars(pb.vars)
      , type(pb.type)
    {
        problem_type = which_problem_type();
    }